

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticities.cpp
# Opt level: O0

M44f * Imf_3_3::RGBtoXYZ(Chromaticities *chroma,float Y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  invalid_argument *piVar23;
  float *pfVar24;
  float *in_RSI;
  int __x;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar25;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar26;
  float fVar27;
  float fVar28;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float fVar29;
  float fVar30;
  float Sb;
  float Sg;
  float Sr;
  float SbN;
  float SgN;
  float SrN;
  float d;
  float Z;
  float X;
  M44f *M;
  
  pMVar25 = in_RDI;
  std::abs((int)in_RDI);
  __x = (int)pMVar25;
  if (extraout_XMM0_Da <= 1.0) {
    std::abs(__x);
    std::abs(__x);
    if (extraout_XMM0_Da_01 * 3.4028235e+38 <= extraout_XMM0_Da_00) {
      piVar23 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar23,"Bad chromaticities: white.y cannot be zero");
      __cxa_throw(piVar23,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  fVar26 = (in_RSI[6] * in_XMM0_Da) / in_RSI[7];
  fVar27 = (((1.0 - in_RSI[6]) - in_RSI[7]) * in_XMM0_Da) / in_RSI[7];
  fVar28 = in_RSI[2] * (in_RSI[1] - in_RSI[5]) +
           *in_RSI * (in_RSI[5] - in_RSI[3]) + in_RSI[4] * (in_RSI[3] - in_RSI[1]);
  fVar1 = in_RSI[5];
  fVar2 = in_RSI[3];
  fVar29 = in_RSI[2];
  fVar30 = in_RSI[5];
  fVar3 = in_RSI[5];
  fVar4 = in_RSI[4];
  fVar5 = in_RSI[3];
  fVar6 = in_RSI[3];
  fVar7 = in_RSI[1];
  fVar8 = in_RSI[5];
  fVar9 = *in_RSI;
  fVar10 = in_RSI[5];
  fVar11 = in_RSI[5];
  fVar12 = in_RSI[4];
  fVar13 = in_RSI[1];
  fVar14 = in_RSI[1];
  fVar15 = in_RSI[3];
  fVar16 = in_RSI[1];
  fVar17 = *in_RSI;
  fVar18 = in_RSI[3];
  fVar19 = in_RSI[3];
  fVar20 = in_RSI[2];
  fVar21 = in_RSI[1];
  fVar22 = in_RSI[1];
  std::abs(__x);
  if (extraout_XMM0_Da_02 < 1.0) {
    std::abs(__x);
    std::abs(__x);
    if (extraout_XMM0_Da_03 < extraout_XMM0_Da_04 * 3.4028235e+38) {
      std::abs(__x);
      std::abs(__x);
      if (extraout_XMM0_Da_05 < extraout_XMM0_Da_06 * 3.4028235e+38) {
        std::abs(__x);
        std::abs(__x);
        if (extraout_XMM0_Da_07 < extraout_XMM0_Da_08 * 3.4028235e+38) goto LAB_0018558b;
      }
    }
    piVar23 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar23,"Bad chromaticities: RGBtoXYZ matrix is degenerate");
    __cxa_throw(piVar23,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0018558b:
  fVar29 = (fVar4 * (in_XMM0_Da * (fVar5 - 1.0) + fVar6 * (fVar26 + fVar27)) +
           fVar26 * (fVar1 - fVar2) +
           -(fVar29 * (in_XMM0_Da * (fVar30 - 1.0) + fVar3 * (fVar26 + fVar27)))) / fVar28;
  fVar30 = (-fVar12 * (in_XMM0_Da * (fVar13 - 1.0) + fVar14 * (fVar26 + fVar27)) +
           fVar26 * (fVar7 - fVar8) +
           fVar9 * (in_XMM0_Da * (fVar10 - 1.0) + fVar11 * (fVar26 + fVar27))) / fVar28;
  fVar28 = (fVar20 * (in_XMM0_Da * (fVar21 - 1.0) + fVar22 * (fVar26 + fVar27)) +
           fVar26 * (fVar15 - fVar16) +
           -(fVar17 * (in_XMM0_Da * (fVar18 - 1.0) + fVar19 * (fVar26 + fVar27)))) / fVar28;
  Imath_3_1::Matrix44<float>::Matrix44(in_RDI);
  fVar1 = *in_RSI;
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,0);
  *pfVar24 = fVar29 * fVar1;
  fVar1 = in_RSI[1];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,0);
  pfVar24[1] = fVar29 * fVar1;
  fVar1 = *in_RSI;
  fVar2 = in_RSI[1];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,0);
  pfVar24[2] = fVar29 * ((1.0 - fVar1) - fVar2);
  fVar1 = in_RSI[2];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,1);
  *pfVar24 = fVar30 * fVar1;
  fVar1 = in_RSI[3];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,1);
  pfVar24[1] = fVar30 * fVar1;
  fVar1 = in_RSI[2];
  fVar2 = in_RSI[3];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,1);
  pfVar24[2] = fVar30 * ((1.0 - fVar1) - fVar2);
  fVar1 = in_RSI[4];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,2);
  *pfVar24 = fVar28 * fVar1;
  fVar1 = in_RSI[5];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,2);
  pfVar24[1] = fVar28 * fVar1;
  fVar1 = in_RSI[4];
  fVar2 = in_RSI[5];
  pfVar24 = Imath_3_1::Matrix44<float>::operator[](in_RDI,2);
  pfVar24[2] = fVar28 * ((1.0 - fVar1) - fVar2);
  return in_RDI;
}

Assistant:

IMATH_NAMESPACE::M44f
RGBtoXYZ (const Chromaticities& chroma, float Y)
{
    //
    // For an explanation of how the color conversion matrix is derived,
    // see Roy Hall, "Illumination and Color in Computer Generated Imagery",
    // Springer-Verlag, 1989, chapter 3, "Perceptual Response"; and
    // Charles A. Poynton, "A Technical Introduction to Digital Video",
    // John Wiley & Sons, 1996, chapter 7, "Color science for video".
    //

    //
    // X and Z values of RGB value (1, 1, 1), or "white"
    //

    // prevent a division that rounds to zero
    if (std::abs (chroma.white.y) <= 1.f &&
        std::abs (chroma.white.x * Y) >= std::abs (chroma.white.y) * FLT_MAX)
    {
        throw std::invalid_argument (
            "Bad chromaticities: white.y cannot be zero");
    }

    float X = chroma.white.x * Y / chroma.white.y;
    float Z = (1 - chroma.white.x - chroma.white.y) * Y / chroma.white.y;

    //
    // Scale factors for matrix rows, compute numerators and common denominator
    //

    float d = chroma.red.x * (chroma.blue.y - chroma.green.y) +
              chroma.blue.x * (chroma.green.y - chroma.red.y) +
              chroma.green.x * (chroma.red.y - chroma.blue.y);

    float SrN =
        (X * (chroma.blue.y - chroma.green.y) -
         chroma.green.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) +
         chroma.blue.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)));

    float SgN =
        (X * (chroma.red.y - chroma.blue.y) +
         chroma.red.x * (Y * (chroma.blue.y - 1) + chroma.blue.y * (X + Z)) -
         chroma.blue.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    float SbN =
        (X * (chroma.green.y - chroma.red.y) -
         chroma.red.x * (Y * (chroma.green.y - 1) + chroma.green.y * (X + Z)) +
         chroma.green.x * (Y * (chroma.red.y - 1) + chroma.red.y * (X + Z)));

    if (std::abs (d) < 1.f && (std::abs (SrN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SgN) >= std::abs (d) * FLT_MAX ||
                               std::abs (SbN) >= std::abs (d) * FLT_MAX))
    {
        // cannot generate matrix if all RGB primaries have the same y value
        // or if they all have the an x value of zero
        // in both cases, the primaries are colinear, which makes them unusable
        throw std::invalid_argument (
            "Bad chromaticities: RGBtoXYZ matrix is degenerate");
    }

    float Sr = SrN / d;
    float Sg = SgN / d;
    float Sb = SbN / d;

    //
    // Assemble the matrix
    //

    IMATH_NAMESPACE::M44f M;

    M[0][0] = Sr * chroma.red.x;
    M[0][1] = Sr * chroma.red.y;
    M[0][2] = Sr * (1 - chroma.red.x - chroma.red.y);

    M[1][0] = Sg * chroma.green.x;
    M[1][1] = Sg * chroma.green.y;
    M[1][2] = Sg * (1 - chroma.green.x - chroma.green.y);

    M[2][0] = Sb * chroma.blue.x;
    M[2][1] = Sb * chroma.blue.y;
    M[2][2] = Sb * (1 - chroma.blue.x - chroma.blue.y);

    return M;
}